

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void __thiscall HawkTracer::parser::Event::~Event(Event *this)

{
  int iVar1;
  Event *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
  *__range2;
  _Hash_node_base *p_Var2;
  
  for (p_Var2 = (this->_values)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    if (p_Var2[6]._M_nxt != (_Hash_node_base *)0x0) {
      iVar1 = *(int *)&p_Var2[6]._M_nxt[10]._M_nxt;
      if (iVar1 == 10) {
        this_00 = (Event *)p_Var2[5]._M_nxt;
        if (this_00 != (Event *)0x0) {
          ~Event(this_00);
          operator_delete(this_00);
        }
      }
      else if (iVar1 == 9) {
        free(p_Var2[5]._M_nxt);
      }
    }
  }
  this_01 = (this->_klass).
            super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  return;
}

Assistant:

Event::~Event()
{
    for (const auto& value : _values)
    {
        if (value.second.field == nullptr)
        {
            continue;
        }

        switch (value.second.field->get_type_id())
        {
        case FieldTypeId::STRING:
            free(value.second.value.f_STRING);
            break;
        case FieldTypeId::STRUCT:
            delete value.second.value.f_EVENT;
            break;
        default:
            break;
        }
    }
}